

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::SetFontCharacteristics
          (ON_Font *this,double point_size,wchar_t *gdi_logfont_name,bool bBold,bool bItalic,
          bool bUnderlined,bool bStrikethrough)

{
  Stretch font_stretch;
  byte bVar1;
  bool bVar2;
  Style local_59;
  Weight local_45;
  bool bStrikethrough_local;
  bool bUnderlined_local;
  bool bItalic_local;
  wchar_t *pwStack_20;
  bool bBold_local;
  wchar_t *gdi_logfont_name_local;
  double point_size_local;
  ON_Font *this_local;
  
  if ((gdi_logfont_name == (wchar_t *)0x0) ||
     (pwStack_20 = gdi_logfont_name, *gdi_logfont_name == L'\0')) {
    pwStack_20 = ON_wString::operator_cast_to_wchar_t_(&Default.m_loc_windows_logfont_name);
  }
  font_stretch = Default.m_font_stretch;
  local_45 = Bold;
  if (!bBold) {
    local_45 = Normal;
  }
  local_59 = Italic;
  if (!bItalic) {
    local_59 = Upright;
  }
  bVar1 = WindowsLogfontCharSetFromFaceName(pwStack_20);
  bVar2 = SetFontCharacteristics
                    (this,point_size,pwStack_20,local_45,local_59,font_stretch,bUnderlined,
                     bStrikethrough,1.6,(uint)bVar1);
  return bVar2;
}

Assistant:

bool ON_Font::SetFontCharacteristics(
  double point_size,
  const wchar_t * gdi_logfont_name,
  bool bBold,
  bool bItalic, 
  bool bUnderlined,
  bool bStrikethrough
)
{
  if (nullptr == gdi_logfont_name || 0 == gdi_logfont_name[0])
  {
    gdi_logfont_name = ON_Font::Default.m_loc_windows_logfont_name;
  }
  return SetFontCharacteristics(
    point_size,
    gdi_logfont_name,
    (bBold ? ON_Font::Weight::Bold :  ON_Font::Weight::Normal),
    (bItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright),
    ON_Font::Default.m_font_stretch,
    bUnderlined,
    bStrikethrough,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsLogfontCharSetFromFaceName(gdi_logfont_name)
    );
}